

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::
int_writer<unsigned_int>
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this,
          buffer_appender<char> output,locale_ref loc,uint value,basic_format_specs<char> *s)

{
  bool bVar1;
  uint in_ECX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined1 local_31;
  
  *in_RDI = in_RSI;
  in_RDI[1] = CONCAT71(in_register_00000011,in_DL);
  in_RDI[2] = in_R8;
  *(uint *)(in_RDI + 3) = in_ECX;
  *(undefined4 *)(in_RDI + 4) = 0;
  bVar1 = is_negative<unsigned_int,_0>(in_ECX);
  if (bVar1) {
    *(undefined1 *)((long)in_RDI + 0x1c) = 0x2d;
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + 1;
    *(int *)(in_RDI + 3) = -*(int *)(in_RDI + 3);
  }
  else if (((*(byte *)(in_RDI[2] + 9) >> 4 & 7) != 0) && ((*(byte *)(in_RDI[2] + 9) >> 4 & 7) != 1))
  {
    local_31 = 0x2b;
    if ((*(byte *)(in_RDI[2] + 9) >> 4 & 7) != 2) {
      local_31 = 0x20;
    }
    *(undefined1 *)((long)in_RDI + 0x1c) = local_31;
    *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + 1;
  }
  return;
}

Assistant:

int_writer(OutputIt output, locale_ref loc, Int value,
             const basic_format_specs<Char>& s)
      : out(output),
        locale(loc),
        specs(s),
        abs_value(static_cast<UInt>(value)),
        prefix_size(0) {
    static_assert(std::is_same<uint32_or_64_or_128_t<Int>, UInt>::value, "");
    if (is_negative(value)) {
      prefix[0] = '-';
      ++prefix_size;
      abs_value = 0 - abs_value;
    } else if (specs.sign != sign::none && specs.sign != sign::minus) {
      prefix[0] = specs.sign == sign::plus ? '+' : ' ';
      ++prefix_size;
    }
  }